

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

string * __thiscall
helics::CoreBroker::quickBrokerQueries_abi_cxx11_(CoreBroker *this,string_view request)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  format_args args;
  bool bVar1;
  undefined1 uVar2;
  BrokerState BVar3;
  string *this_00;
  reference this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_RCX;
  unsigned_long_long in_RDX;
  CoreBroker *in_RSI;
  string *in_RDI;
  json base;
  bool *in_stack_fffffffffffffc08;
  CoreBroker *in_stack_fffffffffffffc10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc18;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *other;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  CoreBroker *in_stack_fffffffffffffc30;
  undefined6 in_stack_fffffffffffffc38;
  undefined2 in_stack_fffffffffffffc3e;
  allocator<char> *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  allocator<char> *__s;
  CoreBroker *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc88;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_338;
  undefined1 in_stack_fffffffffffffce7;
  json *in_stack_fffffffffffffce8;
  BrokerBase *in_stack_fffffffffffffcf0;
  int local_2f4;
  char *local_2f0;
  undefined8 local_2e8;
  unsigned_long_long local_2d0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_2c8;
  allocator<char> local_2b9 [81];
  unsigned_long_long local_268;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_260;
  allocator<char> local_251 [81];
  unsigned_long_long local_200;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_1f8;
  unsigned_long_long local_1d8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_1d0;
  unsigned_long_long local_1b8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_1b0;
  allocator<char> local_1a1 [17];
  unsigned_long_long uVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar5;
  string_view in_stack_fffffffffffffe80;
  allocator<char> local_f3;
  byte local_f2;
  allocator<char> local_f1 [17];
  unsigned_long_long local_e0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_d8;
  byte local_ce;
  allocator<char> local_cd [19];
  byte local_ba;
  allocator<char> local_b9 [41];
  unsigned_long_long local_90;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_88;
  int local_78 [6];
  undefined8 local_60;
  int *local_58;
  char *local_50;
  undefined8 local_48;
  int *local_40;
  char *local_38;
  undefined8 local_30;
  int local_1c;
  int *local_18;
  int *local_10;
  undefined8 *local_8;
  
  BVar3 = (BrokerState)((ulong)in_stack_fffffffffffffc88 >> 0x30);
  local_90 = in_RDX;
  local_88 = in_RCX;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
             (char *)in_stack_fffffffffffffc18);
  __x._M_len._6_2_ = in_stack_fffffffffffffc3e;
  __x._M_len._0_6_ = in_stack_fffffffffffffc38;
  __x._M_str = (char *)in_stack_fffffffffffffc40;
  __y._M_str = (char *)in_stack_fffffffffffffc30;
  __y._M_len = (size_t)in_stack_fffffffffffffc28;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    BVar3 = BrokerBase::getBrokerState((BrokerBase *)0x52912d);
    local_ba = 0;
    local_ce = 0;
    if (BVar3 < OPERATING) {
      std::allocator<char>::allocator();
      local_ce = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    }
    else {
      std::allocator<char>::allocator();
      local_ba = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    }
    if ((local_ce & 1) != 0) {
      std::allocator<char>::~allocator(local_cd);
    }
    if ((local_ba & 1) != 0) {
      std::allocator<char>::~allocator(local_b9);
    }
  }
  else {
    local_e0 = local_90;
    local_d8 = local_88;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
               (char *)in_stack_fffffffffffffc18);
    __x_00._M_len._6_2_ = in_stack_fffffffffffffc3e;
    __x_00._M_len._0_6_ = in_stack_fffffffffffffc38;
    __x_00._M_str = (char *)in_stack_fffffffffffffc40;
    __y_00._M_str = (char *)in_stack_fffffffffffffc30;
    __y_00._M_len = (size_t)in_stack_fffffffffffffc28;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      bVar1 = isConnected(in_stack_fffffffffffffc10);
      local_f2 = 0;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_f2 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
        std::allocator<char>::~allocator(&local_f3);
      }
      if ((local_f2 & 1) != 0) {
        std::allocator<char>::~allocator(local_f1);
      }
    }
    else {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                 (char *)in_stack_fffffffffffffc18);
      __x_01._M_len._6_2_ = in_stack_fffffffffffffc3e;
      __x_01._M_len._0_6_ = in_stack_fffffffffffffc38;
      __x_01._M_str = (char *)in_stack_fffffffffffffc40;
      __y_01._M_str = (char *)in_stack_fffffffffffffc30;
      __y_01._M_len = (size_t)in_stack_fffffffffffffc28;
      bVar1 = std::operator==(__x_01,__y_01);
      if (!bVar1) {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                   (char *)in_stack_fffffffffffffc18);
        __x_02._M_len._6_2_ = in_stack_fffffffffffffc3e;
        __x_02._M_len._0_6_ = in_stack_fffffffffffffc38;
        __x_02._M_str = (char *)in_stack_fffffffffffffc40;
        __y_02._M_str = (char *)in_stack_fffffffffffffc30;
        __y_02._M_len = (size_t)in_stack_fffffffffffffc28;
        bVar1 = std::operator==(__x_02,__y_02);
        if (!bVar1) {
          uVar4 = local_90;
          aVar5 = local_88;
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                     (char *)in_stack_fffffffffffffc18);
          __x_03._M_len._6_2_ = in_stack_fffffffffffffc3e;
          __x_03._M_len._0_6_ = in_stack_fffffffffffffc38;
          __x_03._M_str = (char *)in_stack_fffffffffffffc40;
          __y_03._M_str = (char *)in_stack_fffffffffffffc30;
          __y_03._M_len = (size_t)in_stack_fffffffffffffc28;
          bVar1 = std::operator==(__x_03,__y_03);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40
                      );
            std::allocator<char>::~allocator(local_1a1);
            return in_RDI;
          }
          local_1b8 = local_90;
          local_1b0 = local_88;
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                     (char *)in_stack_fffffffffffffc18);
          __x_04._M_len._6_2_ = in_stack_fffffffffffffc3e;
          __x_04._M_len._0_6_ = in_stack_fffffffffffffc38;
          __x_04._M_str = (char *)in_stack_fffffffffffffc40;
          __y_04._M_str = (char *)in_stack_fffffffffffffc30;
          __y_04._M_len = (size_t)in_stack_fffffffffffffc28;
          bVar1 = std::operator==(__x_04,__y_04);
          if (!bVar1) {
            local_1d8 = local_90;
            local_1d0 = local_88;
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                       (char *)in_stack_fffffffffffffc18);
            __x_05._M_len._6_2_ = in_stack_fffffffffffffc3e;
            __x_05._M_len._0_6_ = in_stack_fffffffffffffc38;
            __x_05._M_str = (char *)in_stack_fffffffffffffc40;
            __y_05._M_str = (char *)in_stack_fffffffffffffc30;
            __y_05._M_len = (size_t)in_stack_fffffffffffffc28;
            bVar1 = std::operator==(__x_05,__y_05);
            if (!bVar1) {
              local_200 = local_90;
              local_1f8 = local_88;
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                         (char *)in_stack_fffffffffffffc18);
              __x_06._M_len._6_2_ = in_stack_fffffffffffffc3e;
              __x_06._M_len._0_6_ = in_stack_fffffffffffffc38;
              __x_06._M_str = (char *)in_stack_fffffffffffffc40;
              __y_06._M_str = (char *)in_stack_fffffffffffffc30;
              __y_06._M_len = (size_t)in_stack_fffffffffffffc28;
              bVar1 = std::operator==(__x_06,__y_06);
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                           in_stack_fffffffffffffc40);
                getAddress_abi_cxx11_(in_stack_fffffffffffffc30);
                std::operator+(in_stack_fffffffffffffc18,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc10);
                std::operator+(in_stack_fffffffffffffc18,
                               (char)((ulong)in_stack_fffffffffffffc10 >> 0x38));
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc10);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc10);
                std::allocator<char>::~allocator(local_251);
                return in_RDI;
              }
              local_268 = local_90;
              local_260 = local_88;
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                         (char *)in_stack_fffffffffffffc18);
              __x_07._M_len._6_2_ = in_stack_fffffffffffffc3e;
              __x_07._M_len._0_6_ = in_stack_fffffffffffffc38;
              __x_07._M_str = (char *)in_stack_fffffffffffffc40;
              __y_07._M_str = (char *)in_stack_fffffffffffffc30;
              __y_07._M_len = (size_t)in_stack_fffffffffffffc28;
              bVar1 = std::operator==(__x_07,__y_07);
              if (bVar1) {
                __s = local_2b9;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc50,(char *)__s,in_stack_fffffffffffffc40);
                std::operator+(in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
                std::operator+(in_stack_fffffffffffffc18,
                               (char)((ulong)in_stack_fffffffffffffc10 >> 0x38));
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc10);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc10);
                std::allocator<char>::~allocator(local_2b9);
                return in_RDI;
              }
              local_2d0 = local_90;
              local_2c8 = local_88;
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                         (char *)in_stack_fffffffffffffc18);
              __x_08._M_len._6_2_ = in_stack_fffffffffffffc3e;
              __x_08._M_len._0_6_ = in_stack_fffffffffffffc38;
              __x_08._M_str = (char *)in_stack_fffffffffffffc40;
              __y_08._M_str = (char *)in_stack_fffffffffffffc30;
              __y_08._M_len = (size_t)in_stack_fffffffffffffc28;
              bVar1 = std::operator==(__x_08,__y_08);
              if (bVar1) {
                local_2f0 = "{}";
                local_2e8 = 2;
                local_2f4 = generateMapObjectCounter(in_stack_fffffffffffffc50);
                local_38 = local_2f0;
                local_30 = local_2e8;
                local_40 = &local_2f4;
                local_50 = local_2f0;
                local_48 = local_2e8;
                local_18 = local_78;
                local_8 = &local_60;
                local_10 = local_78;
                local_60 = 1;
                args.field_1.args_ = aVar5.args_;
                args.desc_ = uVar4;
                local_1c = local_2f4;
                local_78[0] = local_2f4;
                local_58 = local_10;
                ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffe80,args);
                return in_RDI;
              }
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                         (char *)in_stack_fffffffffffffc18);
              __x_09._M_len._6_2_ = in_stack_fffffffffffffc3e;
              __x_09._M_len._0_6_ = in_stack_fffffffffffffc38;
              __x_09._M_str = (char *)in_stack_fffffffffffffc40;
              __y_09._M_str = (char *)in_stack_fffffffffffffc30;
              __y_09._M_len = (size_t)in_stack_fffffffffffffc28;
              bVar1 = std::operator==(__x_09,__y_09);
              if (!bVar1) {
                std::__cxx11::string::string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
                return in_RDI;
              }
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
              BrokerBase::addBaseInformation
                        (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                         (bool)in_stack_fffffffffffffce7);
              BrokerBase::getBrokerState((BrokerBase *)0x529c5b);
              this_00 = brokerStateName_abi_cxx11_(BVar3);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)this_00,in_stack_fffffffffffffc28);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
              other = &local_338;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),other);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffffc10);
              uVar2 = isConnected(in_stack_fffffffffffffc10);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json<bool,_bool,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
              this_01 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)CONCAT17(uVar2,in_stack_fffffffffffffc20),other);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json(this_01);
              fileops::generateJsonString(other,SUB81((ulong)this_01 >> 0x38,0));
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json(this_01);
              return in_RDI;
            }
          }
          generateStringVector<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,helics::CoreBroker::quickBrokerQueries(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                    (in_RDI,querySet_abi_cxx11_);
          return in_RDI;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      getIdentifier_abi_cxx11_(in_RSI);
      std::operator+(in_stack_fffffffffffffc18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc10);
      std::operator+(in_stack_fffffffffffffc18,(char)((ulong)in_stack_fffffffffffffc10 >> 0x38));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc10);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc10);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe87);
    }
  }
  return in_RDI;
}

Assistant:

std::string CoreBroker::quickBrokerQueries(std::string_view request) const
{
    if (request == "isinit") {
        return (getBrokerState() >= BrokerState::OPERATING) ? std::string("true") :
                                                              std::string("false");
    }
    if (request == "isconnected") {
        return (isConnected()) ? std::string("true") : std::string("false");
    }
    if (request == "name" || request == "identifier") {
        return std::string{"\""} + getIdentifier() + '"';
    }
    if (request == "exists") {
        return "true";
    }
    if ((request == "queries") || (request == "available_queries")) {
        return generateStringVector(querySet, [](const std::string& data) { return data; });
    }
    if (request == "address") {
        return std::string{"\""} + getAddress() + '"';
    }
    if (request == "version") {
        return std::string{"\""} + versionString + '"';
    }
    if (request == "counter") {
        return fmt::format("{}", generateMapObjectCounter());
    }
    if (request == "status") {
        nlohmann::json base;
        addBaseInformation(base, !isRootc);
        base["state"] = brokerStateName(getBrokerState());
        base["status"] = isConnected();
        return fileops::generateJsonString(base);
    }
    return {};
}